

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_avx2.c
# Opt level: O0

uint sad64xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar3 [32];
  uint res;
  __m128i sum_sad128;
  __m256i sum_sad_h;
  __m256i sum_sad;
  __m256i ref2_reg;
  __m256i ref1_reg;
  __m256i sad2_reg;
  __m256i sad1_reg;
  int i;
  undefined1 local_330 [16];
  undefined1 local_300 [32];
  int local_244;
  undefined1 (*local_238) [32];
  undefined1 (*local_228) [32];
  uint local_50;
  
  local_300 = ZEXT1632(ZEXT816(0));
  local_238 = in_RDX;
  local_228 = in_RDI;
  for (local_244 = 0; local_244 < in_R8D; local_244 = local_244 + 1) {
    auVar3 = vpsadbw_avx2(*local_238,*local_228);
    auVar2 = vpsadbw_avx2(local_238[1],local_228[1]);
    auVar3 = vpaddd_avx2(auVar3,auVar2);
    local_300 = vpaddd_avx2(local_300,auVar3);
    local_238 = (undefined1 (*) [32])(*local_238 + in_ECX);
    local_228 = (undefined1 (*) [32])(*local_228 + in_ESI);
  }
  auVar3 = vpsrldq_avx2(local_300,8);
  auVar3 = vpaddd_avx2(local_300,auVar3);
  auVar1 = vpaddd_avx(auVar3._0_16_,local_330);
  local_50 = auVar1._0_4_;
  return local_50;
}

Assistant:

static inline unsigned int sad64xh_avx2(const uint8_t *src_ptr, int src_stride,
                                        const uint8_t *ref_ptr, int ref_stride,
                                        int h) {
  int i;
  __m256i sad1_reg, sad2_reg, ref1_reg, ref2_reg;
  __m256i sum_sad = _mm256_setzero_si256();
  __m256i sum_sad_h;
  __m128i sum_sad128;
  for (i = 0; i < h; i++) {
    ref1_reg = _mm256_loadu_si256((__m256i const *)ref_ptr);
    ref2_reg = _mm256_loadu_si256((__m256i const *)(ref_ptr + 32));
    sad1_reg =
        _mm256_sad_epu8(ref1_reg, _mm256_loadu_si256((__m256i const *)src_ptr));
    sad2_reg = _mm256_sad_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(src_ptr + 32)));
    sum_sad = _mm256_add_epi32(sum_sad, _mm256_add_epi32(sad1_reg, sad2_reg));
    ref_ptr += ref_stride;
    src_ptr += src_stride;
  }
  sum_sad_h = _mm256_srli_si256(sum_sad, 8);
  sum_sad = _mm256_add_epi32(sum_sad, sum_sad_h);
  sum_sad128 = _mm256_extracti128_si256(sum_sad, 1);
  sum_sad128 = _mm_add_epi32(_mm256_castsi256_si128(sum_sad), sum_sad128);
  unsigned int res = (unsigned int)_mm_cvtsi128_si32(sum_sad128);
  _mm256_zeroupper();
  return res;
}